

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicGroundCombatSoldier.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GED_BasicGroundCombatSoldier *this)

{
  ostream *poVar1;
  EntityType local_200;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  GED_BasicGroundCombatSoldier *local_18;
  GED_BasicGroundCombatSoldier *this_local;
  
  local_18 = this;
  this_local = (GED_BasicGroundCombatSoldier *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"GED Basic Ground Combat Soldier\n");
  poVar1 = std::operator<<(poVar1,"\tEntity ID:                   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16EntityID);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tLocation Offsets(x,y,z):     ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_i16Offsets[0]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_i16Offsets[1]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_i16Offsets[2]);
  poVar1 = std::operator<<(poVar1,"\n");
  EntityType::EntityType(&local_200,'\x03','\x01',0,'\0','\0','\0','\0');
  DATA_TYPE::EntityAppearance::GetAsString_abi_cxx11_(&local_1f0,&this->m_EA,&local_200);
  UTILS::IndentString(&local_1d0,&local_1f0,1,'\t');
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\tOrientation(Psi,Theta,Phi):  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(short)this->m_i8Ori[0]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(short)this->m_i8Ori[1]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(short)this->m_i8Ori[2]);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tSpeed:                       ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(short)this->m_i8Spd);
  poVar1 = std::operator<<(poVar1,"m/s\n");
  poVar1 = std::operator<<(poVar1,"\tHead Azimuth:                 ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(short)this->m_i8HdAz);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tHeadElevation:               ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(short)this->m_i8HdElv);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tHead Scan Rate:              ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(short)this->m_i8HdScanRt);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tHead Elevation Rate:         ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(short)this->m_i8HdElvRt);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  EntityType::~EntityType(&local_200);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString GED_BasicGroundCombatSoldier::GetAsString() const
{
    KStringStream ss;

    ss << "GED Basic Ground Combat Soldier\n"
       << "\tEntity ID:                   " << m_ui16EntityID  << "\n"
       << "\tLocation Offsets(x,y,z):     " << m_i16Offsets[0] << " " << m_i16Offsets[1] << " " << m_i16Offsets[2] << "\n"
       << IndentString( m_EA.GetAsString( EntityType( Lifeform, Land, 0, 0, 0, 0, 0 ) ), 1 )
       << "\tOrientation(Psi,Theta,Phi):  " << ( KINT16 )m_i8Ori[0]    << " " << ( KINT16 )m_i8Ori[1] << " " << ( KINT16 )m_i8Ori[2] << "\n"
       << "\tSpeed:                       " << ( KINT16 )m_i8Spd       << "m/s\n"
       << "\tHead Azimuth:                 " << ( KINT16 )m_i8HdAz    << "\n"
       << "\tHeadElevation:               " << ( KINT16 )m_i8HdElv     << "\n"
       << "\tHead Scan Rate:              " << ( KINT16 )m_i8HdScanRt << "\n"
       << "\tHead Elevation Rate:         " << ( KINT16 )m_i8HdElvRt   << "\n";

    return ss.str();
}